

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo
          (cmLocalUnixMakefileGenerator3 *this,ostream *cmakefileStream,cmGeneratorTarget *target)

{
  cmMakefile *pcVar1;
  cmLocalCommonGenerator *pcVar2;
  cmLocalCommonGenerator *pcVar3;
  ImplicitDependLanguageMap *pIVar4;
  _Rb_tree_header *p_Var5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  char *pcVar9;
  pointer pbVar10;
  _Base_ptr p_Var11;
  allocator local_122;
  allocator local_121;
  cmLocalUnixMakefileGenerator3 *local_120;
  _Rb_tree_node_base *local_118;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transformRules;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string local_50;
  
  local_120 = this;
  pIVar4 = GetImplicitDepends(this,target);
  std::operator<<(cmakefileStream,
                  "# The set of languages for which implicit dependencies are needed:\n");
  std::operator<<(cmakefileStream,"set(CMAKE_DEPENDS_LANGUAGES\n");
  p_Var5 = &(pIVar4->
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap>_>_>
            )._M_t._M_impl.super__Rb_tree_header;
  for (p_Var7 = (pIVar4->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap>_>_>
                )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != p_Var5; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    poVar6 = std::operator<<(cmakefileStream,"  \"");
    poVar6 = std::operator<<(poVar6,(string *)(p_Var7 + 1));
    std::operator<<(poVar6,"\"\n");
  }
  std::operator<<(cmakefileStream,"  )\n");
  std::operator<<(cmakefileStream,"# The set of files for implicit dependencies of each language:\n"
                 );
  pcVar2 = &local_120->super_cmLocalCommonGenerator;
  pcVar3 = &local_120->super_cmLocalCommonGenerator;
  for (p_Var7 = (pIVar4->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap>_>_>
                )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != p_Var5; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    poVar6 = std::operator<<(cmakefileStream,"set(CMAKE_DEPENDS_CHECK_");
    local_118 = p_Var7 + 1;
    poVar6 = std::operator<<(poVar6,(string *)local_118);
    std::operator<<(poVar6,"\n");
    for (p_Var8 = p_Var7[2]._M_right; p_Var8 != (_Base_ptr)&p_Var7[2]._M_parent;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      for (p_Var11 = *(_Base_ptr *)(p_Var8 + 2); p_Var11 != p_Var8[2]._M_parent;
          p_Var11 = p_Var11 + 1) {
        poVar6 = std::operator<<(cmakefileStream,"  \"");
        poVar6 = std::operator<<(poVar6,(string *)p_Var11);
        std::operator<<(poVar6,"\" ");
        poVar6 = std::operator<<(cmakefileStream,"\"");
        poVar6 = std::operator<<(poVar6,(string *)(p_Var8 + 1));
        std::operator<<(poVar6,"\"\n");
      }
    }
    std::operator<<(cmakefileStream,"  )\n");
    std::__cxx11::string::string((string *)&transformRules,"CMAKE_",(allocator *)&defines);
    std::__cxx11::string::append((string *)&transformRules);
    std::__cxx11::string::append((char *)&transformRules);
    pcVar9 = cmMakefile::GetDefinition
                       ((local_120->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,
                        (string *)&transformRules);
    if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
      poVar6 = std::operator<<(cmakefileStream,"set(CMAKE_");
      poVar6 = std::operator<<(poVar6,(string *)local_118);
      poVar6 = std::operator<<(poVar6,"_COMPILER_ID \"");
      poVar6 = std::operator<<(poVar6,pcVar9);
      std::operator<<(poVar6,"\")\n");
    }
    defines._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    defines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    defines._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &defines._M_t._M_impl.super__Rb_tree_header._M_header;
    defines._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    defines._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         defines._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    cmLocalGenerator::AddCompileDefinitions
              ((cmLocalGenerator *)local_120,&defines,target,&pcVar2->ConfigName,(string *)local_118
              );
    if (defines._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      poVar6 = std::operator<<(cmakefileStream,"\n");
      poVar6 = std::operator<<(poVar6,"# Preprocessor definitions for this target.\n");
      poVar6 = std::operator<<(poVar6,"set(CMAKE_TARGET_DEFINITIONS_");
      poVar6 = std::operator<<(poVar6,(string *)local_118);
      std::operator<<(poVar6,"\n");
      for (p_Var8 = defines._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &defines._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        poVar6 = std::operator<<(cmakefileStream,"  ");
        cmOutputConverter::EscapeForCMake(&local_a8,(string *)(p_Var8 + 1));
        poVar6 = std::operator<<(poVar6,(string *)&local_a8);
        std::operator<<(poVar6,"\n");
        std::__cxx11::string::~string((string *)&local_a8);
      }
      std::operator<<(cmakefileStream,"  )\n");
    }
    poVar6 = std::operator<<(cmakefileStream,"\n");
    std::operator<<(poVar6,"# The include file search paths:\n");
    poVar6 = std::operator<<(cmakefileStream,"set(CMAKE_");
    poVar6 = std::operator<<(poVar6,(string *)local_118);
    std::operator<<(poVar6,"_TARGET_INCLUDE_PATH\n");
    includes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    includes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    includes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar1 = (local_120->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::__cxx11::string::string((string *)&local_50,"CMAKE_BUILD_TYPE",&local_121);
    pcVar9 = cmMakefile::GetSafeDefinition(pcVar1,&local_50);
    std::__cxx11::string::string((string *)&local_a8,pcVar9,&local_122);
    std::__cxx11::string::~string((string *)&local_50);
    cmLocalGenerator::GetIncludeDirectories
              ((cmLocalGenerator *)local_120,&includes,target,(string *)local_118,&local_a8,true);
    for (pbVar10 = includes.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar10 !=
        includes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar10 = pbVar10 + 1) {
      poVar6 = std::operator<<(cmakefileStream,"  \"");
      cmOutputConverter::Convert
                (&local_50,&(pcVar3->super_cmLocalGenerator).super_cmOutputConverter,pbVar10,
                 HOME_OUTPUT,UNCHANGED);
      poVar6 = std::operator<<(poVar6,(string *)&local_50);
      std::operator<<(poVar6,"\"\n");
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::operator<<(cmakefileStream,"  )\n");
    std::__cxx11::string::~string((string *)&local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&includes);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&defines._M_t);
    std::__cxx11::string::~string((string *)&transformRules);
  }
  transformRules.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  transformRules.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  transformRules.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = (local_120->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string
            ((string *)&defines,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM",(allocator *)&local_a8);
  pcVar9 = cmMakefile::GetProperty(pcVar1,(string *)&defines);
  std::__cxx11::string::~string((string *)&defines);
  if (pcVar9 != (char *)0x0) {
    std::__cxx11::string::string((string *)&defines,pcVar9,(allocator *)&local_a8);
    cmSystemTools::ExpandListArgument((string *)&defines,&transformRules,false);
    std::__cxx11::string::~string((string *)&defines);
  }
  std::__cxx11::string::string
            ((string *)&defines,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM",(allocator *)&local_a8);
  pcVar9 = cmGeneratorTarget::GetProperty(target,(string *)&defines);
  std::__cxx11::string::~string((string *)&defines);
  if (pcVar9 != (char *)0x0) {
    std::__cxx11::string::string((string *)&defines,pcVar9,(allocator *)&local_a8);
    cmSystemTools::ExpandListArgument((string *)&defines,&transformRules,false);
    std::__cxx11::string::~string((string *)&defines);
  }
  if (transformRules.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      transformRules.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator<<(cmakefileStream,"set(CMAKE_INCLUDE_TRANSFORMS\n");
    for (pbVar10 = transformRules.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar10 !=
        transformRules.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar10 = pbVar10 + 1) {
      poVar6 = std::operator<<(cmakefileStream,"  ");
      cmOutputConverter::EscapeForCMake((string *)&defines,pbVar10);
      poVar6 = std::operator<<(poVar6,(string *)&defines);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string((string *)&defines);
    }
    std::operator<<(cmakefileStream,"  )\n");
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&transformRules);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3
::WriteDependLanguageInfo(std::ostream& cmakefileStream,
                          cmGeneratorTarget* target)
{
  ImplicitDependLanguageMap const& implicitLangs =
    this->GetImplicitDepends(target);

  // list the languages
  cmakefileStream
    << "# The set of languages for which implicit dependencies are needed:\n";
  cmakefileStream
    << "set(CMAKE_DEPENDS_LANGUAGES\n";
  for(ImplicitDependLanguageMap::const_iterator
        l = implicitLangs.begin(); l != implicitLangs.end(); ++l)
    {
    cmakefileStream << "  \"" << l->first << "\"\n";
    }
  cmakefileStream << "  )\n";

  // now list the files for each language
  cmakefileStream
    << "# The set of files for implicit dependencies of each language:\n";
  for(ImplicitDependLanguageMap::const_iterator
        l = implicitLangs.begin(); l != implicitLangs.end(); ++l)
    {
    cmakefileStream
      << "set(CMAKE_DEPENDS_CHECK_" << l->first << "\n";
    ImplicitDependFileMap const& implicitPairs = l->second;

    // for each file pair
    for(ImplicitDependFileMap::const_iterator pi = implicitPairs.begin();
        pi != implicitPairs.end(); ++pi)
      {
      for(cmDepends::DependencyVector::const_iterator di = pi->second.begin();
          di != pi->second.end(); ++ di)
        {
        cmakefileStream << "  \"" << *di << "\" ";
        cmakefileStream << "\"" << pi->first << "\"\n";
        }
      }
    cmakefileStream << "  )\n";

    // Tell the dependency scanner what compiler is used.
    std::string cidVar = "CMAKE_";
    cidVar += l->first;
    cidVar += "_COMPILER_ID";
    const char* cid = this->Makefile->GetDefinition(cidVar);
    if(cid && *cid)
      {
      cmakefileStream
        << "set(CMAKE_" << l->first << "_COMPILER_ID \""
        << cid << "\")\n";
      }

    // Build a list of preprocessor definitions for the target.
    std::set<std::string> defines;
    this->AddCompileDefinitions(defines, target,
                                this->ConfigName, l->first);
    if(!defines.empty())
      {
      cmakefileStream
        << "\n"
        << "# Preprocessor definitions for this target.\n"
        << "set(CMAKE_TARGET_DEFINITIONS_" << l->first << "\n";
      for(std::set<std::string>::const_iterator di = defines.begin();
          di != defines.end(); ++di)
        {
        cmakefileStream
          << "  " << cmOutputConverter::EscapeForCMake(*di) << "\n";
        }
      cmakefileStream
        << "  )\n";
      }

    // Target-specific include directories:
    cmakefileStream
      << "\n"
      << "# The include file search paths:\n";
    cmakefileStream
      << "set(CMAKE_" << l->first << "_TARGET_INCLUDE_PATH\n";
    std::vector<std::string> includes;


    const std::string& config =
      this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
    this->GetIncludeDirectories(includes, target,
                                l->first, config);
    for(std::vector<std::string>::iterator i = includes.begin();
        i != includes.end(); ++i)
      {
      cmakefileStream
        << "  \""
        << this->Convert(*i, cmLocalGenerator::HOME_OUTPUT)
        << "\"\n";
      }
    cmakefileStream
      << "  )\n";
    }

  // Store include transform rule properties.  Write the directory
  // rules first because they may be overridden by later target rules.
  std::vector<std::string> transformRules;
  if(const char* xform =
     this->Makefile->GetProperty("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM"))
    {
    cmSystemTools::ExpandListArgument(xform, transformRules);
    }
  if(const char* xform =
     target->GetProperty("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM"))
    {
    cmSystemTools::ExpandListArgument(xform, transformRules);
    }
  if(!transformRules.empty())
    {
    cmakefileStream
      << "set(CMAKE_INCLUDE_TRANSFORMS\n";
    for(std::vector<std::string>::const_iterator tri = transformRules.begin();
        tri != transformRules.end(); ++tri)
      {
      cmakefileStream << "  "
          << cmOutputConverter::EscapeForCMake(*tri) << "\n";
      }
    cmakefileStream
      << "  )\n";
    }
}